

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_MinorCompactionsHappen::_Run(_Test_MinorCompactionsHappen *this)

{
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int i_04;
  int i_05;
  uint uVar1;
  int i;
  int starting_num_tables;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  int ending_num_tables;
  undefined1 local_250 [448];
  Options options;
  
  DBTest::CurrentOptions(&options,&this->super_DBTest);
  options.write_buffer_size = 10000;
  DBTest::Reopen(&this->super_DBTest,&options);
  starting_num_tables = DBTest::TotalTableFiles(&this->super_DBTest);
  for (uVar1 = 0; uVar1 != 500; uVar1 = uVar1 + 1) {
    test::Tester::Tester
              ((Tester *)(local_250 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x40c);
    Key_abi_cxx11_(&local_278,(leveldb *)(ulong)uVar1,i_00);
    Key_abi_cxx11_(&local_2d8,(leveldb *)(ulong)uVar1,i_01);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_298,-0x18);
    std::operator+(&local_2b8,&local_2d8,&local_298);
    DBTest::Put((DBTest *)local_250,(string *)this,&local_278);
    test::Tester::IsOk((Tester *)(local_250 + 0x20),(Status *)local_250);
    Status::~Status((Status *)local_250);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_278);
    test::Tester::~Tester((Tester *)(local_250 + 0x20));
  }
  ending_num_tables = DBTest::TotalTableFiles(&this->super_DBTest);
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x40f);
  test::Tester::IsGt<int,int>((Tester *)(local_250 + 0x20),&ending_num_tables,&starting_num_tables);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  for (uVar1 = 0; uVar1 != 500; uVar1 = uVar1 + 1) {
    test::Tester::Tester
              ((Tester *)(local_250 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x412);
    Key_abi_cxx11_(&local_2b8,(leveldb *)(ulong)uVar1,i_02);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2d8,-0x18);
    std::operator+(&local_278,&local_2b8,&local_2d8);
    Key_abi_cxx11_((string *)local_250,(leveldb *)(ulong)uVar1,i_03);
    DBTest::Get(&local_298,&this->super_DBTest,(string *)local_250,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              ((Tester *)(local_250 + 0x20),&local_278,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    test::Tester::~Tester((Tester *)(local_250 + 0x20));
  }
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  for (uVar1 = 0; uVar1 != 500; uVar1 = uVar1 + 1) {
    test::Tester::Tester
              ((Tester *)(local_250 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x418);
    Key_abi_cxx11_(&local_2b8,(leveldb *)(ulong)uVar1,i_04);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2d8,-0x18);
    std::operator+(&local_278,&local_2b8,&local_2d8);
    Key_abi_cxx11_((string *)local_250,(leveldb *)(ulong)uVar1,i_05);
    DBTest::Get(&local_298,&this->super_DBTest,(string *)local_250,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              ((Tester *)(local_250 + 0x20),&local_278,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    test::Tester::~Tester((Tester *)(local_250 + 0x20));
  }
  return;
}

Assistant:

TEST(DBTest, MinorCompactionsHappen) {
  Options options = CurrentOptions();
  options.write_buffer_size = 10000;
  Reopen(&options);

  const int N = 500;

  int starting_num_tables = TotalTableFiles();
  for (int i = 0; i < N; i++) {
    ASSERT_OK(Put(Key(i), Key(i) + std::string(1000, 'v')));
  }
  int ending_num_tables = TotalTableFiles();
  ASSERT_GT(ending_num_tables, starting_num_tables);

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }

  Reopen();

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }
}